

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 ImGui::ScrollToRectEx(ImGuiWindow *window,ImRect *item_rect,ImGuiScrollFlags flags)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  ImVec2 IVar6;
  ImGuiContext *pIVar7;
  byte bVar8;
  uint uVar9;
  byte bVar10;
  uint uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  ImRect local_30;
  
  pIVar7 = GImGui;
  fVar12 = 1.0;
  uVar11 = flags;
  if ((flags & 0x15U) == 0) {
    uVar11 = (uint)window->ScrollbarX | flags;
  }
  fVar17 = (window->InnerRect).Min.x + -1.0;
  fVar13 = (window->InnerRect).Min.y + -1.0;
  fVar16 = (window->InnerRect).Max.x + 1.0;
  fVar14 = (window->InnerRect).Max.y + 1.0;
  if ((uVar11 & 0x2a) == 0) {
    uVar9 = 2;
    if (window->Appearing != false) {
      uVar9 = 0x20;
    }
    uVar11 = uVar11 | uVar9;
  }
  fVar15 = (item_rect->Min).x;
  fVar1 = (item_rect->Min).y;
  fVar2 = (item_rect->Max).x;
  fVar3 = (item_rect->Max).y;
  fVar4 = (GImGui->Style).ItemSpacing.x;
  bVar8 = 1;
  bVar10 = 1;
  if ((fVar16 - fVar17 < fVar4 + fVar4 + (fVar2 - fVar15)) && (window->AutoFitFramesX < '\x01')) {
    bVar10 = ((byte)window->Flags & 0x40) >> 6;
  }
  fVar5 = (GImGui->Style).ItemSpacing.y;
  if ((fVar14 - fVar13 < fVar5 + fVar5 + (fVar3 - fVar1)) && (window->AutoFitFramesY < '\x01')) {
    bVar8 = ((byte)window->Flags & 0x40) >> 6;
  }
  if ((uVar11 & 1) != 0 && (fVar16 < fVar2 || fVar15 < fVar17)) {
    if ((fVar17 <= fVar15 & bVar10) == 0) {
      fVar15 = fVar15 - fVar4;
      fVar12 = 0.0;
    }
    else {
      if (fVar2 < fVar16) goto LAB_001f3e2c;
      fVar15 = fVar2 + fVar4;
    }
LAB_001f3e02:
    (window->ScrollTarget).x = (float)(int)((fVar15 - (window->Pos).x) + (window->Scroll).x);
    (window->ScrollTargetCenterRatio).x = fVar12;
    (window->ScrollTargetEdgeSnapDist).x = 0.0;
  }
  else if ((uVar11 & 4) != 0 && (fVar16 < fVar2 || fVar15 < fVar17) || (uVar11 & 0x10) != 0) {
    fVar12 = 0.0;
    if (bVar10 != 0) {
      fVar12 = 0.5;
      fVar15 = (float)(int)((fVar15 + fVar3) * 0.5);
    }
    goto LAB_001f3e02;
  }
LAB_001f3e2c:
  if ((uVar11 & 2) == 0 || fVar3 <= fVar14 && fVar13 <= fVar1) {
    if (((uVar11 & 8) == 0 || fVar3 <= fVar14 && fVar13 <= fVar1) && (uVar11 & 0x20) == 0)
    goto LAB_001f3ebb;
    fVar12 = (item_rect->Min).y;
    fVar13 = 0.0;
    if (bVar8 != 0) {
      fVar13 = 0.5;
      fVar12 = (float)(int)((fVar12 + (item_rect->Max).y) * 0.5);
    }
  }
  else {
    fVar12 = (item_rect->Min).y;
    if ((fVar13 <= fVar12 & bVar8) == 0) {
      fVar12 = fVar12 - (pIVar7->Style).ItemSpacing.y;
      fVar13 = 0.0;
    }
    else {
      fVar12 = (item_rect->Max).y;
      if (fVar12 < fVar14) goto LAB_001f3ebb;
      fVar12 = fVar12 + (pIVar7->Style).ItemSpacing.y;
      fVar13 = 1.0;
    }
  }
  SetScrollFromPosY(window,fVar12 - (window->Pos).y,fVar13);
LAB_001f3ebb:
  IVar6 = CalcNextScrollFromScrollTargetAndClamp(window);
  fVar12 = IVar6.x - (window->Scroll).x;
  fVar13 = IVar6.y - (window->Scroll).y;
  if (((uVar11 & 0x40) == 0) && ((window->Flags & 0x1000000) != 0)) {
    uVar11 = (flags & 0xffffffeaU) + 1;
    if ((flags & 0x14U) == 0) {
      uVar11 = flags;
    }
    uVar9 = uVar11 & 0xffffffc1 | 2;
    if ((uVar11 & 0x28) == 0) {
      uVar9 = uVar11;
    }
    local_30.Min.x = (item_rect->Min).x - fVar12;
    local_30.Min.y = (item_rect->Min).y - fVar13;
    local_30.Max.x = (item_rect->Max).x - fVar12;
    local_30.Max.y = (item_rect->Max).y - fVar13;
    IVar6 = ScrollToRectEx(window->ParentWindow,&local_30,uVar9);
    fVar12 = fVar12 + IVar6.x;
    fVar13 = fVar13 + IVar6.y;
  }
  IVar6.y = fVar13;
  IVar6.x = fVar12;
  return IVar6;
}

Assistant:

ImVec2 ImGui::ScrollToRectEx(ImGuiWindow* window, const ImRect& item_rect, ImGuiScrollFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImRect window_rect(window->InnerRect.Min - ImVec2(1, 1), window->InnerRect.Max + ImVec2(1, 1));
    //GetForegroundDrawList(window)->AddRect(window_rect.Min, window_rect.Max, IM_COL32_WHITE); // [DEBUG]

    // Check that only one behavior is selected per axis
    IM_ASSERT((flags & ImGuiScrollFlags_MaskX_) == 0 || ImIsPowerOfTwo(flags & ImGuiScrollFlags_MaskX_));
    IM_ASSERT((flags & ImGuiScrollFlags_MaskY_) == 0 || ImIsPowerOfTwo(flags & ImGuiScrollFlags_MaskY_));

    // Defaults
    ImGuiScrollFlags in_flags = flags;
    if ((flags & ImGuiScrollFlags_MaskX_) == 0 && window->ScrollbarX)
        flags |= ImGuiScrollFlags_KeepVisibleEdgeX;
    if ((flags & ImGuiScrollFlags_MaskY_) == 0)
        flags |= window->Appearing ? ImGuiScrollFlags_AlwaysCenterY : ImGuiScrollFlags_KeepVisibleEdgeY;

    const bool fully_visible_x = item_rect.Min.x >= window_rect.Min.x && item_rect.Max.x <= window_rect.Max.x;
    const bool fully_visible_y = item_rect.Min.y >= window_rect.Min.y && item_rect.Max.y <= window_rect.Max.y;
    const bool can_be_fully_visible_x = (item_rect.GetWidth() + g.Style.ItemSpacing.x * 2.0f) <= window_rect.GetWidth() || (window->AutoFitFramesX > 0) || (window->Flags & ImGuiWindowFlags_AlwaysAutoResize) != 0;
    const bool can_be_fully_visible_y = (item_rect.GetHeight() + g.Style.ItemSpacing.y * 2.0f) <= window_rect.GetHeight() || (window->AutoFitFramesY > 0) || (window->Flags & ImGuiWindowFlags_AlwaysAutoResize) != 0;

    if ((flags & ImGuiScrollFlags_KeepVisibleEdgeX) && !fully_visible_x)
    {
        if (item_rect.Min.x < window_rect.Min.x || !can_be_fully_visible_x)
            SetScrollFromPosX(window, item_rect.Min.x - g.Style.ItemSpacing.x - window->Pos.x, 0.0f);
        else if (item_rect.Max.x >= window_rect.Max.x)
            SetScrollFromPosX(window, item_rect.Max.x + g.Style.ItemSpacing.x - window->Pos.x, 1.0f);
    }
    else if (((flags & ImGuiScrollFlags_KeepVisibleCenterX) && !fully_visible_x) || (flags & ImGuiScrollFlags_AlwaysCenterX))
    {
        if (can_be_fully_visible_x)
            SetScrollFromPosX(window, ImFloor((item_rect.Min.x + item_rect.Max.y) * 0.5f) - window->Pos.x, 0.5f);
        else
            SetScrollFromPosX(window, item_rect.Min.x - window->Pos.x, 0.0f);
    }

    if ((flags & ImGuiScrollFlags_KeepVisibleEdgeY) && !fully_visible_y)
    {
        if (item_rect.Min.y < window_rect.Min.y || !can_be_fully_visible_y)
            SetScrollFromPosY(window, item_rect.Min.y - g.Style.ItemSpacing.y - window->Pos.y, 0.0f);
        else if (item_rect.Max.y >= window_rect.Max.y)
            SetScrollFromPosY(window, item_rect.Max.y + g.Style.ItemSpacing.y - window->Pos.y, 1.0f);
    }
    else if (((flags & ImGuiScrollFlags_KeepVisibleCenterY) && !fully_visible_y) || (flags & ImGuiScrollFlags_AlwaysCenterY))
    {
        if (can_be_fully_visible_y)
            SetScrollFromPosY(window, ImFloor((item_rect.Min.y + item_rect.Max.y) * 0.5f) - window->Pos.y, 0.5f);
        else
            SetScrollFromPosY(window, item_rect.Min.y - window->Pos.y, 0.0f);
    }

    ImVec2 next_scroll = CalcNextScrollFromScrollTargetAndClamp(window);
    ImVec2 delta_scroll = next_scroll - window->Scroll;

    // Also scroll parent window to keep us into view if necessary
    if (!(flags & ImGuiScrollFlags_NoScrollParent) && (window->Flags & ImGuiWindowFlags_ChildWindow))
    {
        // FIXME-SCROLL: May be an option?
        if ((in_flags & (ImGuiScrollFlags_AlwaysCenterX | ImGuiScrollFlags_KeepVisibleCenterX)) != 0)
            in_flags = (in_flags & ~ImGuiScrollFlags_MaskX_) | ImGuiScrollFlags_KeepVisibleEdgeX;
        if ((in_flags & (ImGuiScrollFlags_AlwaysCenterY | ImGuiScrollFlags_KeepVisibleCenterY)) != 0)
            in_flags = (in_flags & ~ImGuiScrollFlags_MaskY_) | ImGuiScrollFlags_KeepVisibleEdgeY;
        delta_scroll += ScrollToRectEx(window->ParentWindow, ImRect(item_rect.Min - delta_scroll, item_rect.Max - delta_scroll), in_flags);
    }

    return delta_scroll;
}